

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz_encoder_mf.c
# Opt level: O2

lzma_match *
bt_find_func(uint32_t len_limit,uint32_t pos,uint8_t *cur,uint32_t cur_match,uint32_t depth,
            uint32_t *son,uint32_t cyclic_pos,uint32_t cyclic_size,lzma_match *matches,
            uint32_t len_best)

{
  lzma_match *plVar1;
  uint32_t uVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  uint32_t *puVar7;
  uint uVar8;
  uint uVar9;
  bool bVar10;
  uint32_t local_4c;
  uint32_t *local_48;
  uint32_t *local_40;
  lzma_match *local_38;
  
  local_4c = len_best;
  local_38 = matches;
  local_48 = son + cyclic_pos * 2;
  local_40 = son + (ulong)(cyclic_pos * 2) + 1;
  uVar9 = 0;
  uVar6 = 0;
  do {
    bVar10 = depth == 0;
    depth = depth - 1;
    if ((bVar10) || (uVar8 = pos - cur_match, cyclic_size <= uVar8)) {
      *local_40 = 0;
      *local_48 = 0;
      return local_38;
    }
    uVar2 = 0;
    if (cyclic_pos < uVar8) {
      uVar2 = cyclic_size;
    }
    uVar3 = uVar6;
    if (uVar9 < uVar6) {
      uVar3 = uVar9;
    }
    uVar5 = (ulong)uVar3;
    puVar7 = son + ((cyclic_pos - uVar8) + uVar2) * 2;
    if (cur[uVar5 - uVar8] == cur[uVar5]) {
      do {
        uVar3 = uVar3 + 1;
        if (len_limit == uVar3) {
          uVar5 = (ulong)len_limit;
          goto LAB_00453137;
        }
      } while (cur[(ulong)uVar3 - (ulong)uVar8] == cur[uVar3]);
      uVar5 = (ulong)uVar3;
LAB_00453137:
      uVar4 = (uint)uVar5;
      if (local_4c < uVar4) {
        plVar1 = local_38 + 1;
        local_38->len = uVar4;
        local_38->dist = uVar8 - 1;
        local_4c = uVar4;
        local_38 = plVar1;
        if (len_limit == uVar3) {
          *local_48 = *puVar7;
          *local_40 = puVar7[1];
          return plVar1;
        }
      }
    }
    if (cur[uVar5 - uVar8] < cur[uVar5]) {
      *local_48 = cur_match;
      puVar7 = puVar7 + 1;
      uVar6 = (uint)uVar5;
      local_48 = puVar7;
    }
    else {
      *local_40 = cur_match;
      uVar9 = (uint)uVar5;
      local_40 = puVar7;
    }
    cur_match = *puVar7;
  } while( true );
}

Assistant:

static lzma_match *
bt_find_func(
		const uint32_t len_limit,
		const uint32_t pos,
		const uint8_t *const cur,
		uint32_t cur_match,
		uint32_t depth,
		uint32_t *const son,
		const uint32_t cyclic_pos,
		const uint32_t cyclic_size,
		lzma_match *matches,
		uint32_t len_best)
{
	uint32_t *ptr0 = son + (cyclic_pos << 1) + 1;
	uint32_t *ptr1 = son + (cyclic_pos << 1);

	uint32_t len0 = 0;
	uint32_t len1 = 0;

	while (true) {
		uint32_t *pair;
		const uint8_t *pb;
		uint32_t len;

		const uint32_t delta = pos - cur_match;
		if (depth-- == 0 || delta >= cyclic_size) {
			*ptr0 = EMPTY_HASH_VALUE;
			*ptr1 = EMPTY_HASH_VALUE;
			return matches;
		}

		pair = son + ((cyclic_pos - delta
				+ (delta > cyclic_pos ? cyclic_size : 0))
				<< 1);

		pb = cur - delta;
		len = my_min(len0, len1);

		if (pb[len] == cur[len]) {
			while (++len != len_limit)
				if (pb[len] != cur[len])
					break;

			if (len_best < len) {
				len_best = len;
				matches->len = len;
				matches->dist = delta - 1;
				++matches;

				if (len == len_limit) {
					*ptr1 = pair[0];
					*ptr0 = pair[1];
					return matches;
				}
			}
		}

		if (pb[len] < cur[len]) {
			*ptr1 = cur_match;
			ptr1 = pair + 1;
			cur_match = *ptr1;
			len1 = len;
		} else {
			*ptr0 = cur_match;
			ptr0 = pair;
			cur_match = *ptr0;
			len0 = len;
		}
	}
}